

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void decompose(double *x,int N,int f,double *filter,char *type,double *trend,int *ltrend,
              double *seas,int *lseas,double *random,int *lrandom)

{
  int iVar1;
  int iVar2;
  double *oup;
  double *x_00;
  double *means;
  double dVar3;
  double *seasonalmeans;
  double *detrend;
  double *cout;
  double *filt;
  int batches;
  int clen;
  int f2;
  int j;
  int i;
  int isOdd;
  double *trend_local;
  char *type_local;
  double *filter_local;
  int f_local;
  int N_local;
  double *x_local;
  
  cout = filter;
  if (filter == (double *)0x0) {
    cout = (double *)malloc((long)f << 3);
    for (f2 = 0; f2 < f; f2 = f2 + 1) {
      cout[f2] = 1.0 / (double)f;
    }
  }
  iVar1 = strcmp(type,"additive");
  if ((iVar1 == 0) && (iVar1 = strcmp(type,"multiplicative"), iVar1 == 0)) {
    printf("Type takes only either additive or multiplicative values \n");
    exit(-1);
  }
  iVar1 = f / 2;
  filt._4_4_ = (N - f) + 1;
  oup = (double *)malloc((long)filt._4_4_ << 3);
  convolve("valid","direct",x,N,cout,f,oup);
  if (f % 2 == 0) {
    filt._4_4_ = N - f;
  }
  x_00 = (double *)malloc((long)filt._4_4_ << 3);
  means = (double *)malloc((long)f << 3);
  iVar2 = strcmp(type,"multiplicative");
  f2 = iVar1;
  if (iVar2 == 0) {
    for (; f2 < filt._4_4_ + iVar1; f2 = f2 + 1) {
      x_00[f2 - iVar1] = x[f2] / oup[f2 - iVar1];
    }
  }
  else {
    iVar2 = strcmp(type,"additive");
    if (iVar2 == 0) {
      for (; f2 < filt._4_4_ + iVar1; f2 = f2 + 1) {
        x_00[f2 - iVar1] = x[f2] - oup[f2 - iVar1];
      }
    }
  }
  findMeans(x_00,filt._4_4_,f,means);
  for (f2 = 0; f2 < f - iVar1; f2 = f2 + 1) {
    seas[f2] = means[iVar1 + f2];
  }
  for (f2 = f - iVar1; f2 < f; f2 = f2 + 1) {
    seas[f2] = means[(f2 - f) + iVar1];
  }
  dVar3 = ceil((double)filt._4_4_ / (double)f);
  iVar2 = (int)dVar3;
  for (f2 = 1; f2 < iVar2 + -1; f2 = f2 + 1) {
    for (clen = 0; clen < f; clen = clen + 1) {
      seas[f2 * f + clen] = seas[clen];
    }
  }
  clen = 0;
  for (f2 = f * (iVar2 + -1); f2 < filt._4_4_ - f * (iVar2 + -1); f2 = f2 + 1) {
    seas[f2] = seas[clen];
    clen = clen + 1;
  }
  if (f % 2 == 0) {
    *lseas = filt._4_4_;
    *lrandom = filt._4_4_;
  }
  else {
    *lseas = filt._4_4_ + -1;
    *lrandom = filt._4_4_ + -1;
  }
  memcpy(trend,oup,(long)filt._4_4_ << 3);
  *ltrend = filt._4_4_;
  iVar2 = strcmp(type,"multiplicative");
  f2 = iVar1;
  if (iVar2 == 0) {
    for (; f2 < filt._4_4_ + iVar1; f2 = f2 + 1) {
      random[f2 - iVar1] = x[f2] / trend[f2 - iVar1];
    }
    for (f2 = 0; f2 < filt._4_4_; f2 = f2 + 1) {
      random[f2] = random[f2] / seas[f2];
    }
  }
  else {
    iVar2 = strcmp(type,"additive");
    if (iVar2 == 0) {
      for (; f2 < filt._4_4_ + iVar1; f2 = f2 + 1) {
        random[f2 - iVar1] = x[f2] - trend[f2 - iVar1];
      }
      for (f2 = 0; f2 < filt._4_4_; f2 = f2 + 1) {
        random[f2] = random[f2] - seas[f2];
      }
    }
  }
  if (filter == (double *)0x0) {
    free(cout);
  }
  free(oup);
  free(x_00);
  free(means);
  return;
}

Assistant:

void decompose(double *x,int N, int f,double *filter, const char *type, double *trend, int *ltrend, double *seas, int *lseas, double *random, int *lrandom) {
    int isOdd,i,j,f2,clen,batches;
    double *filt,*cout,*detrend,*seasonalmeans;


    isOdd = f%2;

    if (filter == NULL) {
        filt = (double*) malloc(sizeof(double) * f);
        for(i = 0; i < f;++i) {
            filt[i] = 1.0 / (double) f;
        }
    } else {
        filt = &filter[0];
    }

    if (!(strcmp(type,"additive") || strcmp(type,"multiplicative"))) {
        printf("Type takes only either additive or multiplicative values \n");
        exit(-1);
    }

    f2 = f / 2;
    clen = N - f + 1;

    cout = (double*) malloc(sizeof(double) * clen);

    convolve("valid","direct",x,N,filt,f,cout);

    //mdisplay(cout,1,clen);

    if (!isOdd) {
        clen--;
    }

    detrend = (double*) malloc(sizeof(double) * clen);
    seasonalmeans = (double*) malloc(sizeof(double) * f);

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] / cout[i-f2];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] - cout[i-f2];
        }
    }

    //mdisplay(detrend,1,clen);

    findMeans(detrend,clen,f,seasonalmeans);

    for(i = 0; i < f-f2;++i) {
        seas[i] = seasonalmeans[f2+i];
    }

    for(i = f-f2; i < f;++i) {
        seas[i] = seasonalmeans[i-f+f2];
    }

    batches = ceil((double) clen / (double) f);

    for(i = 1; i < batches-1;++i) {
        for(j = 0; j < f;++j) {
            seas[i*f+j] =seas[j];
        }
    }
    j = 0;
    for( i = f*(batches-1); i < clen - f*(batches-1);++i) {
        seas[i] = seas[j];
        j++;
    }

    if (isOdd) {
        *lseas = clen - 1;
        *lrandom = clen - 1;
    } else {
        *lseas = clen;
        *lrandom = clen;
    }

    memcpy(trend,cout,sizeof(double)*clen);
    *ltrend = clen;

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] / trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] /seas[i];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] - trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] - seas[i];
        }
    }


    if (filter == NULL) {
        free(filt);
    }

    free(cout);
    free(detrend);
    free(seasonalmeans);
}